

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TiledOutputFile::setFrameBuffer(TiledOutputFile *this,FrameBuffer *frameBuffer)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  size_t sVar2;
  size_t sVar3;
  undefined3 uVar4;
  int iVar5;
  undefined4 uVar6;
  PixelType PVar7;
  undefined4 uVar8;
  pointer pTVar9;
  TiledOutputFile *pTVar10;
  int iVar11;
  TOutSliceInfo *__cur;
  ChannelList *this_00;
  const_iterator cVar12;
  ConstIterator CVar13;
  ConstIterator CVar14;
  const_iterator cVar15;
  pointer pTVar16;
  ArgExc *pAVar17;
  ostream *poVar18;
  char *pcVar19;
  pointer pTVar20;
  size_t __n;
  ulong __n_00;
  vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
  slices;
  stringstream _iex_throw_s;
  vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
  local_1d8;
  TiledOutputFile *local_1c0;
  undefined1 local_1b8 [16];
  size_t sStack_1a8;
  size_t sStack_1a0;
  bool local_198;
  ulong local_194;
  
  __mutex = (pthread_mutex_t *)this->_streamData;
  iVar11 = pthread_mutex_lock(__mutex);
  if (iVar11 != 0) {
    std::__throw_system_error(iVar11);
  }
  local_1c0 = this;
  this_00 = Header::channels(&this->_data->header);
  cVar12._M_node = (_Base_ptr)ChannelList::begin(this_00);
  do {
    CVar13 = ChannelList::end(this_00);
    if ((const_iterator)cVar12._M_node == CVar13._i._M_node) {
      local_1d8.
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cVar12._M_node = (_Base_ptr)ChannelList::begin(this_00);
      while( true ) {
        CVar13 = ChannelList::end(this_00);
        pTVar10 = local_1c0;
        if ((const_iterator)cVar12._M_node == CVar13._i._M_node) break;
        CVar14 = FrameBuffer::find(frameBuffer,(char *)(cVar12._M_node + 1));
        cVar15._M_node = (_Base_ptr)FrameBuffer::end(frameBuffer);
        if (CVar14._i._M_node == (const_iterator)cVar15._M_node) {
          local_1b8._0_4_ = cVar12._M_node[9]._M_color;
          sStack_1a0 = 0;
          local_1b8._8_8_ = (char *)0x0;
          sStack_1a8 = 0;
          local_198 = true;
          local_194 = 0;
          std::
          vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
          ::push_back(&local_1d8,(value_type *)local_1b8);
        }
        else {
          local_1b8._0_4_ = *(_Rb_tree_color *)((long)CVar14._i._M_node + 0x120);
          local_1b8._8_8_ = *(undefined8 *)((long)CVar14._i._M_node + 0x128);
          sStack_1a8 = *(size_t *)((long)CVar14._i._M_node + 0x130);
          sStack_1a0 = *(size_t *)((long)CVar14._i._M_node + 0x138);
          local_198 = false;
          local_194 = (ulong)CONCAT14(*(undefined1 *)((long)CVar14._i._M_node + 0x151),
                                      (uint)*(byte *)((long)CVar14._i._M_node + 0x150));
          std::
          vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
          ::push_back(&local_1d8,(value_type *)local_1b8);
        }
        cVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar12._M_node);
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::operator=((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&local_1c0->_data->frameBuffer,
                  (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)frameBuffer);
      pTVar9 = local_1d8.
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pTVar20 = local_1d8.
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar1 = pTVar10->_data;
      __n_00 = (long)local_1d8.
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1d8.
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pTVar16 = (pDVar1->slices).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pDVar1->slices).
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar16) < __n_00
         ) {
        pTVar16 = std::
                  _Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                  ::_M_allocate((_Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                                 *)(((long)__n_00 >> 4) * -0x5555555555555555),(size_t)frameBuffer);
        if (pTVar20 != pTVar9) {
          memcpy(pTVar16,pTVar20,((__n_00 - 0x30) / 0x30) * 0x30 + 0x30);
        }
        pTVar20 = (pDVar1->slices).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pTVar20 != (pointer)0x0) {
          operator_delete(pTVar20,(long)(pDVar1->slices).
                                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pTVar20);
        }
        (pDVar1->slices).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pTVar16;
        (pDVar1->slices).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)pTVar16 + __n_00);
      }
      else {
        pTVar20 = (pDVar1->slices).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)pTVar20 - (long)pTVar16;
        if (__n < __n_00) {
          if (pTVar20 != pTVar16) {
            memmove(pTVar16,local_1d8.
                            super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,__n);
          }
          pTVar16 = (pDVar1->slices).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pTVar20 = (pointer)(((long)pTVar16 -
                                   (long)(pDVar1->slices).
                                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start) +
                                  (long)local_1d8.
                                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
              pTVar20 !=
              local_1d8.
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish; pTVar20 = pTVar20 + 1) {
            PVar7 = pTVar20->type;
            uVar8 = *(undefined4 *)&pTVar20->field_0x4;
            pcVar19 = pTVar20->base;
            sVar2 = pTVar20->xStride;
            sVar3 = pTVar20->yStride;
            uVar4 = *(undefined3 *)&pTVar20->field_0x21;
            iVar11 = pTVar20->xTileCoords;
            iVar5 = pTVar20->yTileCoords;
            uVar6 = *(undefined4 *)&pTVar20->field_0x2c;
            pTVar16->zero = pTVar20->zero;
            *(undefined3 *)&pTVar16->field_0x21 = uVar4;
            pTVar16->xTileCoords = iVar11;
            pTVar16->yTileCoords = iVar5;
            *(undefined4 *)&pTVar16->field_0x2c = uVar6;
            pTVar16->xStride = sVar2;
            pTVar16->yStride = sVar3;
            pTVar16->type = PVar7;
            *(undefined4 *)&pTVar16->field_0x4 = uVar8;
            pTVar16->base = pcVar19;
            pTVar16 = pTVar16 + 1;
          }
        }
        else if (local_1d8.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish !=
                 local_1d8.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
          memmove(pTVar16,local_1d8.
                          super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,__n_00);
        }
      }
      (pDVar1->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(__n_00 + (long)(pDVar1->slices).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      if (local_1d8.
          super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d8.
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1d8.
                              super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d8.
                              super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pthread_mutex_unlock(__mutex);
      return;
    }
    CVar14 = FrameBuffer::find(frameBuffer,(char *)(cVar12._M_node + 1));
    cVar15._M_node = (_Base_ptr)FrameBuffer::end(frameBuffer);
    if (CVar14._i._M_node != (const_iterator)cVar15._M_node) {
      if (cVar12._M_node[9]._M_color != *(_Rb_tree_color *)((long)CVar14._i._M_node + 0x120)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&sStack_1a8,"Pixel type of \"",0xf);
        poVar18 = std::operator<<((ostream *)&sStack_1a8,(char *)(cVar12._M_node + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\" channel of output file \"",0x1a);
        pcVar19 = OStream::fileName(local_1c0->_streamData->os);
        poVar18 = std::operator<<(poVar18,pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\" is not compatible with the frame buffer\'s pixel type.",0x37);
        pAVar17 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar17,(stringstream *)local_1b8);
        __cxa_throw(pAVar17,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if ((*(int *)((long)CVar14._i._M_node + 0x140) != 1) ||
         (*(int *)((long)CVar14._i._M_node + 0x144) != 1)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&sStack_1a8,"All channels in a tiled file must havesampling (1,1).",
                   0x35);
        pAVar17 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar17,(stringstream *)local_1b8);
        __cxa_throw(pAVar17,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
    cVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar12._M_node);
  } while( true );
}

Assistant:

void	
TiledOutputFile::setFrameBuffer (const FrameBuffer &frameBuffer)
{
    Lock lock (*_streamData);

    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (ChannelList::ConstIterator i = channels.begin();
	 i != channels.end();
	 ++i)
    {
	FrameBuffer::ConstIterator j = frameBuffer.find (i.name());

	if (j == frameBuffer.end())
	    continue;

	if (i.channel().type != j.slice().type)
	    THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" channel "
				"of output file \"" << fileName() << "\" is "
				"not compatible with the frame buffer's "
				"pixel type.");

	if (j.slice().xSampling != 1 || j.slice().ySampling != 1)
	    THROW (IEX_NAMESPACE::ArgExc, "All channels in a tiled file must have"
				"sampling (1,1).");
    }
    
    //
    // Initialize slice table for writePixels().
    //

    vector<TOutSliceInfo> slices;

    for (ChannelList::ConstIterator i = channels.begin();
	 i != channels.end();
	 ++i)
    {
	FrameBuffer::ConstIterator j = frameBuffer.find (i.name());

	if (j == frameBuffer.end())
	{
	    //
	    // Channel i is not present in the frame buffer.
	    // In the file, channel i will contain only zeroes.
	    //

	    slices.push_back (TOutSliceInfo (i.channel().type,
					     0, // base
					     0, // xStride,
					     0, // yStride,
					     true)); // zero
	}
	else
	{
	    //
	    // Channel i is present in the frame buffer.
	    //

	    slices.push_back (TOutSliceInfo (j.slice().type,
					     j.slice().base,
					     j.slice().xStride,
					     j.slice().yStride,
					     false, // zero
                                             (j.slice().xTileCoords)? 1: 0,
                                             (j.slice().yTileCoords)? 1: 0));
	}
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;
    _data->slices = slices;
}